

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
          (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *this,Part *t)

{
  QVarLengthArray<(anonymous_namespace)::Part,_32LL> *in_RSI;
  Part *in_stack_ffffffffffffffe8;
  
  append(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void push_back(T &&t) { append(std::move(t)); }